

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O2

bool __thiscall
lambertian::scatter(lambertian *this,ray *r_in,hit_record *rec,vec3 *attenuation,ray *scattered,
                   double *pdf)

{
  double dVar1;
  double dVar2;
  element_type *peVar3;
  double dVar4;
  double dVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  vec3 direction;
  onb uvw;
  vec3 local_a8 [2];
  onb local_78;
  
  local_78.axis[2].e[0] = 0.0;
  local_78.axis[2].e[1] = 0.0;
  local_78.axis[1].e[1] = 0.0;
  local_78.axis[1].e[2] = 0.0;
  local_78.axis[0].e[2] = 0.0;
  local_78.axis[1].e[0] = 0.0;
  local_78.axis[0].e[0] = 0.0;
  local_78.axis[0].e[1] = 0.0;
  local_78.axis[2].e[2] = 0.0;
  onb::build_from_w(&local_78,&rec->normal);
  random_cosine_direction();
  onb::local(&local_78,local_a8);
  random_unit_vector();
  dVar1 = (rec->normal).e[2];
  dVar4 = (rec->normal).e[0];
  dVar5 = (rec->normal).e[1];
  dVar2 = r_in->tm;
  uVar6 = *(undefined4 *)(rec->p).e;
  uVar7 = *(undefined4 *)((long)(rec->p).e + 4);
  uVar8 = *(undefined4 *)((rec->p).e + 1);
  uVar9 = *(undefined4 *)((long)(rec->p).e + 0xc);
  (scattered->orig).e[2] = (rec->p).e[2];
  *(undefined4 *)(scattered->orig).e = uVar6;
  *(undefined4 *)((long)(scattered->orig).e + 4) = uVar7;
  *(undefined4 *)((scattered->orig).e + 1) = uVar8;
  *(undefined4 *)((long)(scattered->orig).e + 0xc) = uVar9;
  (scattered->dir).e[0] = dVar4 + local_a8[0].e[0];
  (scattered->dir).e[1] = dVar5 + local_a8[0].e[1];
  (scattered->dir).e[2] = dVar1 + local_a8[0].e[2];
  scattered->tm = dVar2;
  peVar3 = (this->albedo).super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**peVar3->_vptr_texture)(SUB84(rec->u,0),rec->v,local_a8,peVar3,rec);
  attenuation->e[2] = local_a8[0].e[2];
  attenuation->e[0] = local_a8[0].e[0];
  attenuation->e[1] = local_a8[0].e[1];
  *pdf = (local_78.axis[2].e[2] * (scattered->dir).e[2] +
         local_78.axis[2].e[0] * (scattered->dir).e[0] +
         local_78.axis[2].e[1] * (scattered->dir).e[1]) / 3.141592653589793;
  return true;
}

Assistant:

virtual bool scatter(
            const ray& r_in, const hit_record& rec, vec3& attenuation, ray& scattered, double& pdf
    ) const {
        onb uvw;
        uvw.build_from_w(rec.normal);
        auto direction = uvw.local(random_cosine_direction());
        vec3 scatter_direction = rec.normal + random_unit_vector();
        scattered = ray(rec.p, scatter_direction, r_in.time());
        attenuation = albedo->value(rec.u, rec.v, rec.p);
        pdf = dot(uvw.w(), scattered.direction()) / pi;
        return true;
    }